

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O3

void __thiscall ON_Outline::SortFigures(ON_Outline *this,Orientation outer_loop_orientation)

{
  _func_int **pp_Var1;
  ON_OutlineFigure *pOVar2;
  Orientation OVar3;
  bool bVar4;
  uint uVar5;
  ON_OutlineFigure *pOVar6;
  ulong uVar7;
  ulong uVar8;
  uint i;
  size_t new_capacity;
  long lVar9;
  ulong uVar10;
  Orientation OVar11;
  uint j;
  ON_OutlineFigure *parent_outer_figure;
  ON_OutlineFigure *f;
  ON_SimpleArray<ON_OutlineFigure_*> sorted_figures;
  ON_SimpleArray<ON_OutlineFigure_*> inner_figures;
  ON_SimpleArray<ON_OutlineFigure_*> inner_figures_parent;
  ON_SimpleArray<ON_OutlineFigure_*> ignored_figures;
  ON_BoundingBox figure_bbox;
  ON_OutlineFigure *local_108;
  ON_ClassArray<ON_OutlineFigure> local_100;
  ON_Outline *local_e8;
  ON_SimpleArray<ON_OutlineFigure_*> local_e0;
  ON_SimpleArray<ON_OutlineFigure_*> local_c8;
  size_t local_b0;
  double local_a8;
  _func_int **local_a0;
  ON_SimpleArray<ON_OutlineFigure_*> local_98;
  ON_SimpleArray<ON_OutlineFigure_*> local_80;
  ON_ClassArray<ON_OutlineFigure> *local_68;
  ON_BoundingBox local_60;
  
  if ((byte)(outer_loop_orientation - NotOriented) < 0xfe) {
    return;
  }
  if (this->m_sorted_figure_outer_orientation == Error ||
      this->m_sorted_figure_outer_orientation == outer_loop_orientation) {
    return;
  }
  this->m_sorted_figure_outer_orientation = outer_loop_orientation;
  new_capacity = (size_t)(this->m_figures).m_count;
  if ((long)new_capacity < 1) {
    return;
  }
  local_e0._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080fcc8;
  local_e0.m_a = (ON_OutlineFigure **)0x0;
  local_e0.m_count = 0;
  local_e0.m_capacity = 0;
  local_e8 = this;
  ON_SimpleArray<ON_OutlineFigure_*>::SetCapacity(&local_e0,new_capacity);
  local_a0 = (_func_int **)&PTR__ON_SimpleArray_0080fcc8;
  local_80._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080fcc8;
  local_80.m_a = (ON_OutlineFigure **)0x0;
  local_80.m_count = 0;
  local_80.m_capacity = 0;
  ON_SimpleArray<ON_OutlineFigure_*>::SetCapacity(&local_80,new_capacity);
  local_68 = &local_e8->m_figures;
  OVar11 = Clockwise - (outer_loop_orientation == Clockwise);
  lVar9 = 0;
  local_b0 = new_capacity;
  do {
    pOVar6 = (local_e8->m_figures).m_a;
    local_c8._vptr_ON_SimpleArray = (_func_int **)((long)&pOVar6->m_units_per_em + lVar9);
    uVar5 = (uint)(&pOVar6->m_figure_type)[lVar9];
    if ((uVar5 < 5) && ((0x13U >> (uVar5 & 0x1f) & 1) != 0)) {
      local_a8 = ON_OutlineFigure::AreaEstimate((ON_OutlineFigure *)local_c8._vptr_ON_SimpleArray);
      ON_OutlineFigure::BoundingBox(&local_60,(ON_OutlineFigure *)local_c8._vptr_ON_SimpleArray);
      OVar3 = ON_OutlineFigure::FigureOrientation((ON_OutlineFigure *)local_c8._vptr_ON_SimpleArray)
      ;
      if (((local_a8 == 0.0) && (!NAN(local_a8))) ||
         ((((bVar4 = ON_IsValid(local_a8), !bVar4 ||
            (bVar4 = ON_BoundingBox::IsNotEmpty(&local_60), !bVar4)) ||
           (bVar4 = ON_BoundingBox::IsPoint(&local_60), bVar4)) ||
          (OVar3 != outer_loop_orientation && OVar11 != OVar3)))) {
        *(Type *)((long)local_c8._vptr_ON_SimpleArray + 5) = NotPerimeter;
        goto LAB_0048e57c;
      }
      ON_SimpleArray<ON_OutlineFigure_*>::Append(&local_e0,(ON_OutlineFigure **)&local_c8);
    }
    else {
LAB_0048e57c:
      ON_SimpleArray<ON_OutlineFigure_*>::Append(&local_80,(ON_OutlineFigure **)&local_c8);
    }
    pp_Var1 = local_a0;
    lVar9 = lVar9 + 0x48;
  } while (new_capacity * 0x48 != lVar9);
  uVar10 = local_e0._16_8_ & 0xffffffff;
  uVar8 = uVar10;
  if (local_e0.m_count < 1 || local_e0.m_a == (ON_OutlineFigure **)0x0) {
    local_60.m_min.x = (double)local_a0;
    local_60.m_min.y = 0.0;
    local_60.m_min.z = 0.0;
    if (uVar10 == 0) {
      local_c8._vptr_ON_SimpleArray = local_a0;
      local_c8.m_a = (ON_OutlineFigure **)0x0;
      local_c8.m_count = 0;
      local_c8.m_capacity = 0;
      local_98._vptr_ON_SimpleArray = local_a0;
      local_98.m_a = (ON_OutlineFigure **)0x0;
      local_98.m_count = 0;
      local_98.m_capacity = 0;
      goto LAB_0048e74f;
    }
  }
  else if ((uint)local_e0.m_count < 2) {
    uVar8 = 1;
  }
  else {
    ON_qsort(local_e0.m_a,uVar10,8,Internal_CompareAreaEstimate);
  }
  local_60.m_min.z = 0.0;
  local_60.m_min.y = 0.0;
  local_60.m_min.x = (double)pp_Var1;
  ON_SimpleArray<ON_OutlineFigure_*>::SetCapacity
            ((ON_SimpleArray<ON_OutlineFigure_*> *)&local_60,uVar8);
  local_c8._vptr_ON_SimpleArray = pp_Var1;
  local_c8.m_a = (ON_OutlineFigure **)0x0;
  local_c8.m_count = 0;
  local_c8.m_capacity = 0;
  ON_SimpleArray<ON_OutlineFigure_*>::SetCapacity(&local_c8,uVar8);
  local_98._vptr_ON_SimpleArray = pp_Var1;
  local_98.m_a = (ON_OutlineFigure **)0x0;
  local_98.m_count = 0;
  local_98.m_capacity = 0;
  ON_SimpleArray<ON_OutlineFigure_*>::SetCapacity(&local_98,uVar8);
  uVar8 = 0;
  do {
    local_100._vptr_ON_ClassArray = (_func_int **)local_e0.m_a[uVar8];
    local_108 = (ON_OutlineFigure *)0x0;
    if (uVar8 == 0) {
LAB_0048e718:
      ON_SimpleArray<ON_OutlineFigure_*>::Append
                ((ON_SimpleArray<ON_OutlineFigure_*> *)&local_60,(ON_OutlineFigure **)&local_100);
      OVar3 = ON_OutlineFigure::FigureOrientation((ON_OutlineFigure *)local_100._vptr_ON_ClassArray)
      ;
      if (OVar11 == OVar3) {
LAB_0048e739:
        ON_OutlineFigure::ReverseFigure((ON_OutlineFigure *)local_100._vptr_ON_ClassArray);
      }
    }
    else {
      uVar7 = 0;
      do {
        pOVar6 = local_e0.m_a[uVar7];
        bVar4 = ON_OutlineFigure::IsInsideOf
                          ((ON_OutlineFigure *)local_100._vptr_ON_ClassArray,pOVar6,false);
        pOVar2 = local_108;
        if (((bVar4) &&
            (OVar3 = ON_OutlineFigure::FigureOrientation(pOVar6), pOVar2 = pOVar6,
            OVar3 != outer_loop_orientation)) &&
           (OVar3 = ON_OutlineFigure::FigureOrientation(pOVar6), pOVar2 = local_108, OVar11 == OVar3
           )) {
          local_108 = (ON_OutlineFigure *)0x0;
          pOVar2 = local_108;
        }
        local_108 = pOVar2;
        uVar7 = uVar7 + 1;
      } while (uVar8 != uVar7);
      if (local_108 == (ON_OutlineFigure *)0x0) goto LAB_0048e718;
      ON_SimpleArray<ON_OutlineFigure_*>::Append(&local_c8,(ON_OutlineFigure **)&local_100);
      ON_SimpleArray<ON_OutlineFigure_*>::Append(&local_98,&local_108);
      OVar3 = ON_OutlineFigure::FigureOrientation((ON_OutlineFigure *)local_100._vptr_ON_ClassArray)
      ;
      if (OVar3 == outer_loop_orientation) goto LAB_0048e739;
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 != uVar10);
LAB_0048e74f:
  local_a8 = (double)((ulong)local_60.m_min.z & 0xffffffff);
  if (local_a8 == 0.0) {
    local_e8->m_sorted_figure_outer_orientation = Error;
  }
  else {
    uVar8 = local_c8._16_8_ & 0xffffffff;
    if (uVar8 != 0) {
      if (-1 < (long)local_e0._16_8_) {
        local_e0._16_8_ = local_e0._16_8_ & 0xffffffff00000000;
      }
      uVar10 = 0;
      do {
        local_100._vptr_ON_ClassArray = *(_func_int ***)((long)local_60.m_min.y + uVar10 * 8);
        if ((ON_OutlineFigure *)local_100._vptr_ON_ClassArray != (ON_OutlineFigure *)0x0) {
          ON_SimpleArray<ON_OutlineFigure_*>::Append(&local_e0,(ON_OutlineFigure **)&local_100);
          uVar7 = 0;
          do {
            if ((ON_OutlineFigure *)local_100._vptr_ON_ClassArray == local_98.m_a[uVar7]) {
              local_108 = local_c8.m_a[uVar7];
              local_c8.m_a[uVar7] = (ON_OutlineFigure *)0x0;
              local_98.m_a[uVar7] = (ON_OutlineFigure *)0x0;
              if (local_108 != (ON_OutlineFigure *)0x0) {
                ON_SimpleArray<ON_OutlineFigure_*>::Append(&local_e0,&local_108);
              }
            }
            uVar7 = uVar7 + 1;
          } while (uVar8 != uVar7);
        }
        uVar10 = uVar10 + 1;
      } while ((double)uVar10 != local_a8);
      if (local_80.m_count != 0) {
        uVar8 = 0;
        uVar5 = local_80.m_count;
        do {
          local_100._vptr_ON_ClassArray = (_func_int **)local_80.m_a[uVar8];
          if ((ON_OutlineFigure *)local_100._vptr_ON_ClassArray != (ON_OutlineFigure *)0x0) {
            ON_SimpleArray<ON_OutlineFigure_*>::Append(&local_e0,(ON_OutlineFigure **)&local_100);
            uVar5 = local_80.m_count;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < uVar5);
      }
      if (local_e0.m_count == (int)local_b0) {
        uVar10 = local_b0 & 0xffffffff;
        pOVar6 = (local_e8->m_figures).m_a + -1;
        uVar8 = 0;
        do {
          pOVar6 = pOVar6 + 1;
          if (pOVar6 != local_e0.m_a[uVar8]) {
            local_100._vptr_ON_ClassArray = (_func_int **)&PTR__ON_ClassArray_0080fc80;
            local_100.m_a = (ON_OutlineFigure *)0x0;
            local_100.m_count = 0;
            local_100.m_capacity = 0;
            ON_ClassArray<ON_OutlineFigure>::SetCapacity(&local_100,local_b0);
            uVar8 = 0;
            do {
              ON_ClassArray<ON_OutlineFigure>::Append(&local_100,local_e0.m_a[uVar8]);
              uVar8 = uVar8 + 1;
            } while (uVar10 != uVar8);
            ON_ClassArray<ON_OutlineFigure>::operator=(local_68,&local_100);
            ON_ClassArray<ON_OutlineFigure>::~ON_ClassArray(&local_100);
            break;
          }
          uVar8 = uVar8 + 1;
        } while (uVar10 != uVar8);
      }
    }
  }
  ON_SimpleArray<ON_OutlineFigure_*>::~ON_SimpleArray(&local_98);
  ON_SimpleArray<ON_OutlineFigure_*>::~ON_SimpleArray(&local_c8);
  ON_SimpleArray<ON_OutlineFigure_*>::~ON_SimpleArray
            ((ON_SimpleArray<ON_OutlineFigure_*> *)&local_60);
  ON_SimpleArray<ON_OutlineFigure_*>::~ON_SimpleArray(&local_80);
  ON_SimpleArray<ON_OutlineFigure_*>::~ON_SimpleArray(&local_e0);
  return;
}

Assistant:

void ON_Outline::SortFigures(
  ON_OutlineFigure::Orientation outer_loop_orientation
)
{
  if (
    ON_OutlineFigure::Orientation::Clockwise != outer_loop_orientation
    && ON_OutlineFigure::Orientation::CounterClockwise != outer_loop_orientation
    )
    return;

  if (outer_loop_orientation == m_sorted_figure_outer_orientation)
    return;

  if (ON_OutlineFigure::Orientation::Error == m_sorted_figure_outer_orientation)
    return; // not sortable

   m_sorted_figure_outer_orientation = outer_loop_orientation;

  const int figure_count = m_figures.Count();
  if (figure_count <= 0)
    return;

  const ON_OutlineFigure::Orientation inner_loop_orientation
    = (ON_OutlineFigure::Orientation::Clockwise == outer_loop_orientation)
    ? ON_OutlineFigure::Orientation::CounterClockwise
    : ON_OutlineFigure::Orientation::Clockwise;

  ON_SimpleArray<ON_OutlineFigure*> sorted_figures(figure_count);
  ON_SimpleArray<ON_OutlineFigure*> ignored_figures(figure_count);

  for (int i = 0; i < figure_count; i++)
  {
    ON_OutlineFigure* ptr = &m_figures[i];
    if (
      (ON_OutlineFigure::Type::Perimeter == ptr->FigureType()
        || ON_OutlineFigure::Type::Unknown == ptr->FigureType()
        || ON_OutlineFigure::Type::Unset == ptr->FigureType())
      )
    {
      const double figure_area = ptr->AreaEstimate();
      const ON_BoundingBox figure_bbox = ptr->BoundingBox();
      const ON_OutlineFigure::Orientation figure_orientation = ptr->FigureOrientation();

      if (
        0.0 != figure_area && ON_IsValid(figure_area)
        && figure_bbox.IsNotEmpty() && false == figure_bbox.IsPoint()
        && (outer_loop_orientation == figure_orientation
          || inner_loop_orientation == figure_orientation)
        )
      {
        sorted_figures.Append(ptr);
        continue;
      }

      // Mark this figure has NotPerimeter because something about
      // its path is not valid. This will prevent it from being 
      // used in meshing.
      ptr->m_figure_type = ON_OutlineFigure::Type::NotPerimeter;
    }

    // ignored figures are ones that are not a perimeter of an inner
    // or outer boundary.
    ignored_figures.Append(ptr);
  }

  const unsigned int sorted_figure_count = sorted_figures.UnsignedCount();

  // Sort figures so the ones with largest included area are first.
  sorted_figures.QuickSort(Internal_CompareAreaEstimate);

  // As we look at each element of sorted_figures[], it gets assigned to
  // outer_figures[] or inner_figures[]. If it is assigned to inner_figures[],
  // the smallest figure that contains it is assigned to inner_figures_parent[].
  //
  // Over the years, many more complicated approaches to sorting were tried,
  // all of which attempted to take into account the orientations from the font file. 
  // It is so common for the orientations in the font files to be wrong, 
  // that ignoring them is the most efficient and reliable approach to date.
  // It is extremly common for outer figures to overlap.
  ON_SimpleArray<ON_OutlineFigure*> outer_figures(sorted_figure_count);
  ON_SimpleArray<ON_OutlineFigure*> inner_figures(sorted_figure_count);
  ON_SimpleArray<ON_OutlineFigure*> inner_figures_parent(sorted_figure_count);

  for (  unsigned k = 0; k < sorted_figure_count; ++k)
  {
    ON_OutlineFigure* f = sorted_figures[k];

    // This for(int k0; ...) loop finds the smallest larger figure that contains f and uses
    // the orientation of this containing loop to determine the orientation of f.
    ON_OutlineFigure* parent_outer_figure = nullptr;
    for (unsigned k0 = 0; k0 < k; ++k0)
    {
      // Given our assumptions, it is impossible for bigger_f to be inside of f.
      ON_OutlineFigure* bigger_f = sorted_figures[k0];
      if (false == f->IsInsideOf(bigger_f, false))
        continue;

      if (outer_loop_orientation == bigger_f->FigureOrientation())
      {
        // f is inside of bigger_f and bigger_f is an outer loop.
        parent_outer_figure = bigger_f;
      }
      else if (inner_loop_orientation == bigger_f->FigureOrientation())
      {
        // f is inside of bigger_f and bigger_f is an inner loop.
        // So f is a nested outer (like the registered trademark glyph)
        parent_outer_figure = nullptr;
      }
    }

    if (nullptr == parent_outer_figure)
    {
      outer_figures.Append(f);
      if (inner_loop_orientation == f->FigureOrientation())
      {
        // convert this figure to an outer.
        f->ReverseFigure();
      }
    }
    else
    {
      inner_figures.Append(f);
      inner_figures_parent.Append(parent_outer_figure);
      if (outer_loop_orientation == f->FigureOrientation())
      {
        // convert this figure to an inner
        f->ReverseFigure();
      }
    }
  }

  const unsigned outer_count = outer_figures.UnsignedCount();
  const unsigned inner_count = inner_figures.UnsignedCount();

  if ( 0 == outer_count )
  {
    m_sorted_figure_outer_orientation = ON_OutlineFigure::Orientation::Error;
    return;
  }

  if (0 == inner_count)
  {
    return;
  }

  // Sort figures by outer followed by its inners.
  sorted_figures.SetCount(0);
    for (unsigned i = 0; i < outer_count; ++i)
  {
    ON_OutlineFigure* outer_figure = outer_figures[i];
    if (nullptr == outer_figure)
      continue;
    sorted_figures.Append(outer_figure);
    for (unsigned j = 0; j < inner_count; ++j)
    {
      if (outer_figure == inner_figures_parent[j])
      {
        ON_OutlineFigure* inner_figure = inner_figures[j];
        inner_figures[j] = nullptr;
        inner_figures_parent[j] = nullptr;
        if (nullptr != inner_figure)
          sorted_figures.Append(inner_figure);
      }
    }
  }

  // Put single stroke and other non-perimeter figures on the end.
  for (unsigned int k = 0; k < ignored_figures.UnsignedCount(); k++)
  {
    ON_OutlineFigure* f = ignored_figures[k];
    if (nullptr != f)
      sorted_figures.Append(f);
  }

  if (sorted_figures.Count() == figure_count)
  {
    for (int k = 0; k < figure_count; k++)
    {
      if (sorted_figures[k] != &m_figures[k])
      {
        // Need to reorder m_figures[] array
        ON_ClassArray<ON_OutlineFigure> tmp(figure_count);
        for (int i = 0; i < figure_count; i++)
        {
          tmp.Append(*sorted_figures[i]);
        }
        m_figures = tmp;
        break;
      }
    }
  }

  return;
}